

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.cc
# Opt level: O1

void __thiscall
tchecker::parsing::program::parser_t::yypush_(parser_t *this,char *m,state_type s,symbol_type *sym)

{
  basic_symbol<tchecker::parsing::program::parser_t::by_state> bStack_78;
  
  stack_symbol_type::stack_symbol_type((stack_symbol_type *)&bStack_78,s,sym);
  yypush_(this,m,(stack_symbol_type *)&bStack_78);
  basic_symbol<tchecker::parsing::program::parser_t::by_state>::~basic_symbol(&bStack_78);
  return;
}

Assistant:

void
  parser_t::yypush_ (const char* m, state_type s, YY_MOVE_REF (symbol_type) sym)
  {
#if 201103L <= YY_CPLUSPLUS
    yypush_ (m, stack_symbol_type (s, std::move (sym)));
#else
    stack_symbol_type ss (s, sym);
    yypush_ (m, ss);
#endif
  }